

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

char * lj_debug_slotname(GCproto *pt,BCIns *ip,BCReg slot,char **name)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  BCIns *pBVar4;
  
  do {
    pcVar2 = debug_varname(pt,(BCPos)((ulong)((long)ip - (long)(pt + 1)) >> 2),slot);
    if (pcVar2 != (char *)0x0) {
      *name = pcVar2;
      return "local";
    }
    do {
      while( true ) {
        pBVar4 = ip;
        ip = pBVar4 + -1;
        if (ip <= pt + 1) {
          return (char *)0x0;
        }
        uVar1 = *ip;
        uVar3 = uVar1 >> 8 & 0xff;
        if ((lj_bc_mode[uVar1 & 0xff] & 7) == 1) break;
        if (((lj_bc_mode[uVar1 & 0xff] & 7) == 2) && (uVar3 <= slot)) {
          if ((uVar1 & 0xff) != 0x2c) {
            return (char *)0x0;
          }
          if (slot <= uVar1 >> 0x10) {
            return (char *)0x0;
          }
        }
      }
    } while (uVar3 != slot);
    if ((char)uVar1 != '\x12') {
      uVar3 = uVar1 & 0xff;
      if (uVar3 == 0x2d) {
        pcVar2 = lj_debug_uvname(pt,uVar1 >> 0x10);
        *name = pcVar2;
        return "upvalue";
      }
      if (uVar3 == 0x39) {
        *name = (char *)((ulong)*(uint *)((ulong)(pt->k).ptr32 +
                                         (long)(int)(~uVar1 >> 0x10 | 0xffffff00) * 4) + 0x10);
        uVar3 = pBVar4[-2];
        if ((((char)uVar3 == '\x12') && ((uVar3 >> 8 & 0xff) == slot + 1)) &&
           (uVar3 >> 0x10 == uVar1 >> 0x18)) {
          return "method";
        }
        return "field";
      }
      if (uVar3 != 0x36) {
        return (char *)0x0;
      }
      *name = (char *)((ulong)*(uint *)((ulong)(pt->k).ptr32 + (long)(int)~(uVar1 >> 0x10) * 4) +
                      0x10);
      return "global";
    }
    slot = uVar1 >> 0x10;
  } while( true );
}

Assistant:

const char *lj_debug_slotname(GCproto *pt, const BCIns *ip, BCReg slot,
			      const char **name)
{
  const char *lname;
restart:
  lname = debug_varname(pt, proto_bcpos(pt, ip), slot);
  if (lname != NULL) { *name = lname; return "local"; }
  while (--ip > proto_bc(pt)) {
    BCIns ins = *ip;
    BCOp op = bc_op(ins);
    BCReg ra = bc_a(ins);
    if (bcmode_a(op) == BCMbase) {
      if (slot >= ra && (op != BC_KNIL || slot <= bc_d(ins)))
	return NULL;
    } else if (bcmode_a(op) == BCMdst && ra == slot) {
      switch (bc_op(ins)) {
      case BC_MOV:
	if (ra == slot) { slot = bc_d(ins); goto restart; }
	break;
      case BC_GGET:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_d(ins))));
	return "global";
      case BC_TGETS:
	*name = strdata(gco2str(proto_kgc(pt, ~(ptrdiff_t)bc_c(ins))));
	if (ip > proto_bc(pt)) {
	  BCIns insp = ip[-1];
	  if (bc_op(insp) == BC_MOV && bc_a(insp) == ra+1+LJ_FR2 &&
	      bc_d(insp) == bc_b(ins))
	    return "method";
	}
	return "field";
      case BC_UGET:
	*name = lj_debug_uvname(pt, bc_d(ins));
	return "upvalue";
      default:
	return NULL;
      }
    }
  }
  return NULL;
}